

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_conv_transpose_2d_p0(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int stride)

{
  ggml_tensor *pgVar1;
  int64_t ne [4];
  long local_38;
  long local_30;
  int64_t local_28;
  int64_t local_20;
  
  if (a->ne[3] == b->ne[2]) {
    local_38 = (b->ne[0] + -1) * (long)stride + a->ne[0];
    local_30 = (b->ne[1] + -1) * (long)stride + a->ne[1];
    local_28 = a->ne[2];
    local_20 = b->ne[3];
    pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_38,(ggml_tensor *)0x0,0);
    pgVar1->op_params[0] = stride;
    pgVar1->op = GGML_OP_CONV_TRANSPOSE_2D;
    pgVar1->src[0] = a;
    pgVar1->src[1] = b;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x1011,
             "GGML_ASSERT(%s) failed","a->ne[3] == b->ne[2]");
}

Assistant:

struct ggml_tensor * ggml_conv_transpose_2d_p0(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   stride) {
    GGML_ASSERT(a->ne[3] == b->ne[2]);

    const int64_t ne[4] = {
        ggml_calc_conv_transpose_output_size(b->ne[0], a->ne[0], stride, 0 /*p0*/),
        ggml_calc_conv_transpose_output_size(b->ne[1], a->ne[1], stride, 0 /*p1*/),
        a->ne[2], b->ne[3],
    };

    struct ggml_tensor* result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    ggml_set_op_params_i32(result, 0, stride);

    result->op     = GGML_OP_CONV_TRANSPOSE_2D;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}